

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::DoubleValue::_InternalSerialize
          (DoubleValue *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  double dVar1;
  ulong uVar2;
  uint8_t *puVar3;
  
  if ((this->field_0)._impl_.value_ != 0.0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    dVar1 = (this->field_0)._impl_.value_;
    *target = '\t';
    *(double *)(target + 1) = dVar1;
    target = target + 9;
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar3 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* DoubleValue::_InternalSerialize(
            ::uint8_t* target,
            ::google::protobuf::io::EpsCopyOutputStream* stream) const {
          const DoubleValue& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DoubleValue)
          ::uint32_t cached_has_bits = 0;
          (void)cached_has_bits;

          // double value = 1;
          if (::absl::bit_cast<::uint64_t>(this_._internal_value()) != 0) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteDoubleToArray(
                1, this_._internal_value(), target);
          }

          if (PROTOBUF_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
            target =
                ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
                    this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
          }
          // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DoubleValue)
          return target;
        }